

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O1

object_ptr __thiscall mjs::make_regexp(mjs *this,gc_heap_ptr<mjs::global_object> *global,regexp *re)

{
  undefined8 extraout_RDX;
  object_ptr oVar1;
  gc_heap_ptr_untyped local_30;
  size_type local_20;
  pointer local_18;
  
  local_18 = (re->pattern_)._M_dataplus._M_p;
  local_20 = (re->pattern_)._M_string_length;
  regexp_object::make((gc_heap_ptr<mjs::global_object> *)&local_30,(wstring_view *)global,
                      (regexp_flag)&local_20);
  *(gc_heap **)this = local_30.heap_;
  *(uint32_t *)(this + 8) = local_30.pos_;
  if (local_30.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_30.heap_,(gc_heap_ptr_untyped *)this);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_30);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr make_regexp(const gc_heap_ptr<global_object>& global, const regexp& re) {
    return regexp_object::make(global, re.pattern(), re.flags());
}